

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  secp256k1_ge generated;
  secp256k1_gej generatedj;
  secp256k1_scalar scalar_i;
  secp256k1_fe z;
  secp256k1_context *ctx;
  uchar rand32 [32];
  secp256k1_ge group [13];
  secp256k1_gej groupj [13];
  int i;
  secp256k1_context *in_stack_fffffffffffff168;
  secp256k1_context *ctx_00;
  uint in_stack_fffffffffffff17c;
  secp256k1_fe *in_stack_fffffffffffff180;
  secp256k1_fe *in_stack_fffffffffffff198;
  secp256k1_gej *in_stack_fffffffffffff1a0;
  secp256k1_gej *in_stack_fffffffffffff1c8;
  secp256k1_ge *in_stack_fffffffffffff1d0;
  int local_e28;
  char *in_stack_fffffffffffff1f0;
  secp256k1_ge *in_stack_fffffffffffff208;
  int in_stack_fffffffffffff214;
  secp256k1_ge_storage *in_stack_fffffffffffff218;
  secp256k1_ge_storage *in_stack_fffffffffffff220;
  secp256k1_ge *in_stack_fffffffffffff228;
  secp256k1_context *in_stack_fffffffffffff230;
  secp256k1_gej *in_stack_fffffffffffff238;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffff240;
  secp256k1_ge *in_stack_fffffffffffff278;
  secp256k1_context *in_stack_fffffffffffff280;
  secp256k1_ge *in_stack_fffffffffffff2b8;
  secp256k1_context *in_stack_fffffffffffff2c0;
  secp256k1_ge *in_stack_fffffffffffff308;
  secp256k1_context *in_stack_fffffffffffff310;
  int aiStack_cc8 [8];
  secp256k1_gej *in_stack_fffffffffffff358;
  secp256k1_ge *in_stack_fffffffffffff360;
  secp256k1_ge *in_stack_fffffffffffff3e0;
  secp256k1_gej *in_stack_fffffffffffff3e8;
  secp256k1_gej *in_stack_fffffffffffff3f0;
  secp256k1_gej *in_stack_fffffffffffff438;
  secp256k1_ge *in_stack_fffffffffffff440;
  int in_stack_fffffffffffff484;
  secp256k1_ge *in_stack_fffffffffffff488;
  secp256k1_ge_storage *in_stack_fffffffffffff490;
  secp256k1_context *in_stack_fffffffffffffb00;
  secp256k1_ge *in_stack_fffffffffffffe08;
  secp256k1_context *in_stack_fffffffffffffe10;
  uint local_14;
  
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n",0xd);
  if (1 < in_EDI) {
    lVar2 = strtol((char *)in_RSI[1],(char **)0x0,0);
    count = (int)lVar2;
  }
  printf("test count = %i\n",(ulong)(uint)count);
  if (in_EDI < 3) {
    ctx_00 = (secp256k1_context *)0x0;
  }
  else {
    ctx_00 = (secp256k1_context *)in_RSI[2];
  }
  secp256k1_testrand_init(in_stack_fffffffffffff1f0);
  if (4 < in_EDI) {
    lVar2 = strtol((char *)in_RSI[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar2;
    uVar3 = strtol((char *)in_RSI[4],(char **)0x0,0);
    this_core = (uint32_t)uVar3;
    if ((num_cores == 0) || (num_cores <= this_core)) {
      fprintf(_stderr,"Usage: %s [count] [seed] [numcores] [thiscore]\n",*in_RSI);
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar3 & 0xffffffff,(ulong)num_cores - 1)
    ;
  }
  secp256k1_ecmult_gen_compute_table
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,in_stack_fffffffffffff484);
  secp256k1_ecmult_compute_two_tables
            (in_stack_fffffffffffff220,in_stack_fffffffffffff218,in_stack_fffffffffffff214,
             in_stack_fffffffffffff208);
  do {
    if (count == 0) {
      count = count + -1;
      secp256k1_testrand_finish();
      printf("no problems found\n");
      return 0;
    }
    count = count + -1;
    secp256k1_context_create(in_stack_fffffffffffff17c);
    secp256k1_testrand256((uchar *)ctx_00);
    iVar1 = secp256k1_context_randomize(in_stack_fffffffffffff168,(uchar *)0x10b4ae);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
              ,0x1c2,"test condition failed: secp256k1_context_randomize(ctx, rand32)");
      abort();
    }
    secp256k1_gej_set_infinity((secp256k1_gej *)0x10b504);
    secp256k1_ge_set_gej(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
    for (local_14 = 1; (int)local_14 < 0xd; local_14 = local_14 + 1) {
      secp256k1_gej_add_ge
                (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
      secp256k1_ge_set_gej(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
      if (count != 0) {
        random_fe(in_stack_fffffffffffff180);
        secp256k1_gej_rescale(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
      }
      secp256k1_scalar_set_int((secp256k1_scalar *)&stack0xfffffffffffff27c,local_14);
      secp256k1_ecmult_gen
                (in_stack_fffffffffffff240,in_stack_fffffffffffff238,
                 (secp256k1_scalar *)in_stack_fffffffffffff230);
      secp256k1_ge_set_gej(in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8);
      if (aiStack_cc8[(long)(int)local_14 * 0x1a] != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                ,0x1dc,"test condition failed: group[i].infinity == 0");
        abort();
      }
      if (local_e28 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                ,0x1dd,"test condition failed: generated.infinity == 0");
        abort();
      }
      iVar1 = secp256k1_fe_equal_var(&in_stack_fffffffffffff1a0->x,in_stack_fffffffffffff198);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                ,0x1de,"test condition failed: secp256k1_fe_equal_var(&generated.x, &group[i].x)");
        abort();
      }
      iVar1 = secp256k1_fe_equal_var(&in_stack_fffffffffffff1a0->x,in_stack_fffffffffffff198);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests_exhaustive.c"
                ,0x1df,"test condition failed: secp256k1_fe_equal_var(&generated.y, &group[i].y)");
        abort();
      }
    }
    test_exhaustive_endomorphism(in_stack_fffffffffffff1d0);
    test_exhaustive_addition(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
    test_exhaustive_ecmult(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    test_exhaustive_ecmult_multi(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
    test_exhaustive_sign(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
    test_exhaustive_verify(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8);
    test_exhaustive_extrakeys(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    test_exhaustive_schnorrsig(in_stack_fffffffffffffb00);
    test_exhaustive_ellswift(in_stack_fffffffffffff280,in_stack_fffffffffffff278);
    secp256k1_context_destroy(ctx_00);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    secp256k1_testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, ECMULT_GEN_PREC_BITS);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        secp256k1_testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal_var(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal_var(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    secp256k1_testrand_finish();

    printf("no problems found\n");
    return 0;
}